

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

bool __thiscall lzham::lzcompressor::reset(lzcompressor *this)

{
  bool bVar1;
  
  if (this->m_src_size < 0) {
    return false;
  }
  search_accelerator::reset(&this->m_accel);
  lzham::symbol_codec::reset();
  coding_stats::clear(&this->m_stats);
  this->m_src_size = 0;
  this->m_src_adler32 = 1;
  if ((this->m_block_buf).m_size != 0) {
    (this->m_block_buf).m_size = 0;
  }
  if ((this->m_comp_buf).m_size != 0) {
    (this->m_comp_buf).m_size = 0;
  }
  *(undefined8 *)((long)&this->m_block_start_dict_ofs + 1) = 0;
  this->m_step = 0;
  this->m_block_start_dict_ofs = 0;
  state::reset(&this->m_state);
  if (((this->m_params).m_num_seed_bytes != 0) && (bVar1 = init_seed_bytes(this), !bVar1)) {
    return false;
  }
  bVar1 = send_zlib_header(this);
  return bVar1;
}

Assistant:

bool lzcompressor::reset()
   {
      if (m_src_size < 0)
         return false;

      m_accel.reset();
      m_codec.reset();
      m_stats.clear();
      m_src_size = 0;
      m_src_adler32 = cInitAdler32;
      m_block_buf.try_resize(0);
      m_comp_buf.try_resize(0);

      m_step = 0;
      m_finished = false;
      m_block_start_dict_ofs = 0;
      m_block_index = 0;
      m_state.reset();

      if (m_params.m_num_seed_bytes)
      {
         if (!init_seed_bytes())
         {
            LZHAM_LOG_ERROR(7012);
            return false;
         }
      }

      return send_zlib_header();
   }